

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

unsigned_long * __thiscall
rapidjson::internal::Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
PushUnsafe<unsigned_long>
          (Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *this,size_t count)

{
  unsigned_long *puVar1;
  unsigned_long *ret;
  size_t count_local;
  Stack<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *this_local;
  
  if (this->stackTop_ == (char *)0x0) {
    __assert_fail("stackTop_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                  ,0x82,
                  "T *rapidjson::internal::Stack<rapidjson::MemoryPoolAllocator<>>::PushUnsafe(size_t) [Allocator = rapidjson::MemoryPoolAllocator<>, T = unsigned long]"
                 );
  }
  if ((long)(count * 8) <= (long)this->stackEnd_ - (long)this->stackTop_) {
    puVar1 = (unsigned_long *)this->stackTop_;
    this->stackTop_ = this->stackTop_ + count * 8;
    return puVar1;
  }
  __assert_fail("static_cast<std::ptrdiff_t>(sizeof(T) * count) <= (stackEnd_ - stackTop_)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                ,0x83,
                "T *rapidjson::internal::Stack<rapidjson::MemoryPoolAllocator<>>::PushUnsafe(size_t) [Allocator = rapidjson::MemoryPoolAllocator<>, T = unsigned long]"
               );
}

Assistant:

RAPIDJSON_FORCEINLINE T* PushUnsafe(size_t count = 1) {
        RAPIDJSON_ASSERT(stackTop_);
        RAPIDJSON_ASSERT(static_cast<std::ptrdiff_t>(sizeof(T) * count) <= (stackEnd_ - stackTop_));
        T* ret = reinterpret_cast<T*>(stackTop_);
        stackTop_ += sizeof(T) * count;
        return ret;
    }